

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool PSBTInputSignedAndVerified
               (PartiallySignedTransaction psbt,uint input_index,PrecomputedTransactionData *txdata)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  long in_RDX;
  long lVar12;
  undefined4 in_register_0000003c;
  long *plVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BaseSignatureChecker local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  CTxOut local_50;
  long local_28;
  
  plVar13 = (long *)CONCAT44(in_register_0000003c,input_index);
  uVar11 = (ulong)txdata & 0xffffffff;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::CTxOut(&local_50);
  lVar5 = plVar13[0xe];
  if ((ulong)((plVar13[0xf] - lVar5 >> 5) * -0x70a3d70a3d70a3d7) < uVar11) {
    __assert_fail("psbt.inputs.size() >= input_index",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/psbt.cpp"
                  ,0x12d,
                  "bool PSBTInputSignedAndVerified(const PartiallySignedTransaction, unsigned int, const PrecomputedTransactionData *)"
                 );
  }
  lVar1 = lVar5 + uVar11 * 800;
  lVar5 = *(long *)(lVar5 + uVar11 * 800);
  if (lVar5 == 0) {
    if (*(long *)(lVar1 + 0x10) != -1) {
      local_50.nValue = *(long *)(lVar1 + 0x10);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&local_50.scriptPubKey.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(lVar1 + 0x18));
LAB_0036a6d8:
      uStack_70 = plVar13;
      if (in_RDX == 0) {
        local_78._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_006cbac0;
        local_68 = CONCAT44((int)txdata,1);
        uStack_60 = local_50.nValue;
        local_58 = 0;
        bVar10 = VerifyScript((CScript *)(lVar1 + 0x78),&local_50.scriptPubKey,
                              (CScriptWitness *)(lVar1 + 0x98),0x1fffdf,&local_78,(ScriptError *)0x0
                             );
      }
      else {
        local_78._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_006cbac0;
        local_68 = CONCAT44((int)txdata,1);
        uStack_60 = local_50.nValue;
        local_58 = in_RDX;
        bVar10 = VerifyScript((CScript *)(lVar1 + 0x78),&local_50.scriptPubKey,
                              (CScriptWitness *)(lVar1 + 0x98),0x1fffdf,&local_78,(ScriptError *)0x0
                             );
      }
      goto LAB_0036a767;
    }
  }
  else {
    lVar6 = *plVar13;
    lVar12 = uVar11 * 0x68;
    pp_Var7 = *(_func_int ***)(lVar6 + lVar12);
    plVar2 = (long *)((undefined8 *)(lVar6 + lVar12))[1];
    puVar3 = (undefined8 *)(lVar6 + 0x10 + lVar12);
    uVar8 = *puVar3;
    lVar9 = puVar3[1];
    uVar4 = *(uint *)(lVar6 + 0x20 + lVar12);
    uVar11 = (ulong)uVar4;
    local_58 = CONCAT44(local_58._4_4_,uVar4);
    uVar14 = (*(long *)(lVar5 + 0x20) - *(long *)(lVar5 + 0x18) >> 3) * -0x3333333333333333;
    local_78._vptr_BaseSignatureChecker = pp_Var7;
    uStack_70 = plVar2;
    local_68 = uVar8;
    uStack_60 = lVar9;
    if (uVar11 <= uVar14 && uVar14 - uVar11 != 0) {
      local_68._0_1_ = (char)uVar8;
      local_68._1_1_ = (char)((ulong)uVar8 >> 8);
      local_68._2_1_ = (char)((ulong)uVar8 >> 0x10);
      local_68._3_1_ = (char)((ulong)uVar8 >> 0x18);
      local_68._4_1_ = (char)((ulong)uVar8 >> 0x20);
      local_68._5_1_ = (char)((ulong)uVar8 >> 0x28);
      local_68._6_1_ = (char)((ulong)uVar8 >> 0x30);
      local_68._7_1_ = (char)((ulong)uVar8 >> 0x38);
      uStack_60._0_1_ = (char)lVar9;
      uStack_60._1_1_ = (char)((ulong)lVar9 >> 8);
      uStack_60._2_1_ = (char)((ulong)lVar9 >> 0x10);
      uStack_60._3_1_ = (char)((ulong)lVar9 >> 0x18);
      uStack_60._4_1_ = (char)((ulong)lVar9 >> 0x20);
      uStack_60._5_1_ = (char)((ulong)lVar9 >> 0x28);
      uStack_60._6_1_ = (char)((ulong)lVar9 >> 0x30);
      uStack_60._7_1_ = (char)((ulong)lVar9 >> 0x38);
      auVar16[0] = -(*(char *)(lVar5 + 0x49) == (char)local_68);
      auVar16[1] = -(*(char *)(lVar5 + 0x4a) == local_68._1_1_);
      auVar16[2] = -(*(char *)(lVar5 + 0x4b) == local_68._2_1_);
      auVar16[3] = -(*(char *)(lVar5 + 0x4c) == local_68._3_1_);
      auVar16[4] = -(*(char *)(lVar5 + 0x4d) == local_68._4_1_);
      auVar16[5] = -(*(char *)(lVar5 + 0x4e) == local_68._5_1_);
      auVar16[6] = -(*(char *)(lVar5 + 0x4f) == local_68._6_1_);
      auVar16[7] = -(*(char *)(lVar5 + 0x50) == local_68._7_1_);
      auVar16[8] = -(*(char *)(lVar5 + 0x51) == (char)uStack_60);
      auVar16[9] = -(*(char *)(lVar5 + 0x52) == uStack_60._1_1_);
      auVar16[10] = -(*(char *)(lVar5 + 0x53) == uStack_60._2_1_);
      auVar16[0xb] = -(*(char *)(lVar5 + 0x54) == uStack_60._3_1_);
      auVar16[0xc] = -(*(char *)(lVar5 + 0x55) == uStack_60._4_1_);
      auVar16[0xd] = -(*(char *)(lVar5 + 0x56) == uStack_60._5_1_);
      auVar16[0xe] = -(*(char *)(lVar5 + 0x57) == uStack_60._6_1_);
      auVar16[0xf] = -(*(char *)(lVar5 + 0x58) == uStack_60._7_1_);
      local_78._vptr_BaseSignatureChecker._0_1_ = (char)pp_Var7;
      local_78._vptr_BaseSignatureChecker._1_1_ = (char)((ulong)pp_Var7 >> 8);
      local_78._vptr_BaseSignatureChecker._2_1_ = (char)((ulong)pp_Var7 >> 0x10);
      local_78._vptr_BaseSignatureChecker._3_1_ = (char)((ulong)pp_Var7 >> 0x18);
      local_78._vptr_BaseSignatureChecker._4_1_ = (char)((ulong)pp_Var7 >> 0x20);
      local_78._vptr_BaseSignatureChecker._5_1_ = (char)((ulong)pp_Var7 >> 0x28);
      local_78._vptr_BaseSignatureChecker._6_1_ = (char)((ulong)pp_Var7 >> 0x30);
      local_78._vptr_BaseSignatureChecker._7_1_ = (char)((ulong)pp_Var7 >> 0x38);
      uStack_70._0_1_ = (char)plVar2;
      uStack_70._1_1_ = (char)((ulong)plVar2 >> 8);
      uStack_70._2_1_ = (char)((ulong)plVar2 >> 0x10);
      uStack_70._3_1_ = (char)((ulong)plVar2 >> 0x18);
      uStack_70._4_1_ = (char)((ulong)plVar2 >> 0x20);
      uStack_70._5_1_ = (char)((ulong)plVar2 >> 0x28);
      uStack_70._6_1_ = (char)((ulong)plVar2 >> 0x30);
      uStack_70._7_1_ = (char)((ulong)plVar2 >> 0x38);
      auVar15[0] = -(*(char *)(lVar5 + 0x39) == (char)local_78._vptr_BaseSignatureChecker);
      auVar15[1] = -(*(char *)(lVar5 + 0x3a) == local_78._vptr_BaseSignatureChecker._1_1_);
      auVar15[2] = -(*(char *)(lVar5 + 0x3b) == local_78._vptr_BaseSignatureChecker._2_1_);
      auVar15[3] = -(*(char *)(lVar5 + 0x3c) == local_78._vptr_BaseSignatureChecker._3_1_);
      auVar15[4] = -(*(char *)(lVar5 + 0x3d) == local_78._vptr_BaseSignatureChecker._4_1_);
      auVar15[5] = -(*(char *)(lVar5 + 0x3e) == local_78._vptr_BaseSignatureChecker._5_1_);
      auVar15[6] = -(*(char *)(lVar5 + 0x3f) == local_78._vptr_BaseSignatureChecker._6_1_);
      auVar15[7] = -(*(char *)(lVar5 + 0x40) == local_78._vptr_BaseSignatureChecker._7_1_);
      auVar15[8] = -(*(char *)(lVar5 + 0x41) == (char)uStack_70);
      auVar15[9] = -(*(char *)(lVar5 + 0x42) == uStack_70._1_1_);
      auVar15[10] = -(*(char *)(lVar5 + 0x43) == uStack_70._2_1_);
      auVar15[0xb] = -(*(char *)(lVar5 + 0x44) == uStack_70._3_1_);
      auVar15[0xc] = -(*(char *)(lVar5 + 0x45) == uStack_70._4_1_);
      auVar15[0xd] = -(*(char *)(lVar5 + 0x46) == uStack_70._5_1_);
      auVar15[0xe] = -(*(char *)(lVar5 + 0x47) == uStack_70._6_1_);
      auVar15[0xf] = -(*(char *)(lVar5 + 0x48) == uStack_70._7_1_);
      auVar15 = auVar15 & auVar16;
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        plVar2 = (long *)(*(long *)(lVar5 + 0x18) + uVar11 * 0x28);
        local_50.nValue = *plVar2;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&local_50.scriptPubKey.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(plVar2 + 1));
        goto LAB_0036a6d8;
      }
    }
  }
  bVar10 = false;
LAB_0036a767:
  if (0x1c < local_50.scriptPubKey.super_CScriptBase._size) {
    free(local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    local_50.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool PSBTInputSignedAndVerified(const PartiallySignedTransaction psbt, unsigned int input_index, const PrecomputedTransactionData* txdata)
{
    CTxOut utxo;
    assert(psbt.inputs.size() >= input_index);
    const PSBTInput& input = psbt.inputs[input_index];

    if (input.non_witness_utxo) {
        // If we're taking our information from a non-witness UTXO, verify that it matches the prevout.
        COutPoint prevout = psbt.tx->vin[input_index].prevout;
        if (prevout.n >= input.non_witness_utxo->vout.size()) {
            return false;
        }
        if (input.non_witness_utxo->GetHash() != prevout.hash) {
            return false;
        }
        utxo = input.non_witness_utxo->vout[prevout.n];
    } else if (!input.witness_utxo.IsNull()) {
        utxo = input.witness_utxo;
    } else {
        return false;
    }

    if (txdata) {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, *txdata, MissingDataBehavior::FAIL});
    } else {
        return VerifyScript(input.final_script_sig, utxo.scriptPubKey, &input.final_script_witness, STANDARD_SCRIPT_VERIFY_FLAGS, MutableTransactionSignatureChecker{&(*psbt.tx), input_index, utxo.nValue, MissingDataBehavior::FAIL});
    }
}